

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_hook.h
# Opt level: O0

bool __thiscall
absl::base_internal::
AtomicHook<void_(*)(absl::LogSeverity,_const_char_*,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::DoStore(AtomicHook<void_(*)(absl::LogSeverity,_const_char_*,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *this,FnPtr fn)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  bool same_value_already_stored;
  bool store_succeeded;
  FnPtr expected;
  memory_order in_stack_00000050;
  memory_order in_stack_00000054;
  __pointer_type in_stack_00000058;
  __pointer_type *in_stack_00000060;
  atomic<void_(*)(absl::LogSeverity,_const_char_*,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_00000068;
  bool local_29;
  
  if (in_RSI != 0) {
    lVar1 = *(long *)(in_RDI + 8);
    local_29 = std::
               atomic<void_(*)(absl::LogSeverity,_const_char_*,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               ::compare_exchange_strong
                         (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000054,
                          in_stack_00000050);
    local_29 = local_29 || lVar1 == in_RSI;
    return local_29;
  }
  __assert_fail("fn",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/base/internal/atomic_hook.h"
                ,0x99,
                "bool absl::base_internal::AtomicHook<void (*)(absl::LogSeverity, const char *, int, const std::basic_string<char> &)>::DoStore(FnPtr) [T = void (*)(absl::LogSeverity, const char *, int, const std::basic_string<char> &)]"
               );
}

Assistant:

bool DoStore(FnPtr fn) {
    assert(fn);
    FnPtr expected = default_fn_;
    const bool store_succeeded = hook_.compare_exchange_strong(
        expected, fn, std::memory_order_acq_rel, std::memory_order_acquire);
    const bool same_value_already_stored = (expected == fn);
    return store_succeeded || same_value_already_stored;
  }